

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzerResults.cpp
# Opt level: O1

void __thiscall
HdlcAnalyzerResults::GenInformationFieldString
          (HdlcAnalyzerResults *this,Frame *frame,DisplayBase display_base,bool tabular)

{
  undefined7 in_register_00000009;
  HdlcAnalyzerResults *this_00;
  string escStr;
  char numberStr [64];
  char informationStr [64];
  string local_b8;
  char local_98 [64];
  char local_58 [64];
  
  AnalyzerHelpers::GetNumberString(*(ulonglong *)(frame + 0x10),display_base,8,local_58,0x40);
  this_00 = (HdlcAnalyzerResults *)0x1;
  AnalyzerHelpers::GetNumberString(*(ulonglong *)(frame + 0x18),Decimal,0x20,local_98,0x40);
  GenEscapedString_abi_cxx11_(&local_b8,this_00,frame);
  if ((int)CONCAT71(in_register_00000009,tabular) == 0) {
    AnalyzerResults::AddResultString
              ((char *)this,"I",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString((char *)this,"I ",local_98,(char *)0x0,(char *)0x0,(char *)0x0)
    ;
    AnalyzerResults::AddResultString((char *)this,"I ",local_98," [",local_58,"]");
    AnalyzerResults::AddResultString((char *)this,"Info ",local_98," [",local_58,"]");
  }
  else {
    AnalyzerResults::AddTabularText((char *)this,"Info ",local_98," [",local_58,"]");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void HdlcAnalyzerResults::GenInformationFieldString( const Frame& frame, const DisplayBase display_base, bool tabular )
{
    char informationStr[ 64 ];
    AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, informationStr, 64 );
    char numberStr[ 64 ];
    AnalyzerHelpers::GetNumberString( frame.mData2, Decimal, 32, numberStr, 64 );

    string escStr = GenEscapedString( frame );

    if( !tabular )
    {
        AddResultString( "I" );
        AddResultString( "I ", numberStr );
        AddResultString( "I ", numberStr, " [", informationStr, "]", escStr.c_str() );
        AddResultString( "Info ", numberStr, " [", informationStr, "]", escStr.c_str() );
    }
    else
        AddTabularText( "Info ", numberStr, " [", informationStr, "]", escStr.c_str() );
}